

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schemeobject.cpp
# Opt level: O1

shared_ptr<ASTNode> __thiscall SchemeInt::to_AST(SchemeInt *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  long *in_RSI;
  shared_ptr<ASTNode> sVar2;
  undefined1 local_3d;
  ast_type_t local_3c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  local_3c = INT;
  (**(code **)(*in_RSI + 0x10))(&local_38);
  (this->super_SchemeObject)._vptr_SchemeObject = (_func_int **)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<ASTNode,std::allocator<ASTNode>,ast_type_t,std::__cxx11::string>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this->value,(ASTNode **)this,
             (allocator<ASTNode> *)&local_3d,&local_3c,&local_38);
  _Var1._M_pi = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    _Var1._M_pi = extraout_RDX_00;
  }
  sVar2.super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var1._M_pi;
  sVar2.super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<ASTNode>)sVar2.super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ASTNode> SchemeInt::to_AST() const
{
    return std::make_shared<ASTNode>(ast_type_t::INT, external_repr());
}